

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O0

Int128 btConvexHullInternal::Int128::mul(int64_t a,int64_t b)

{
  long in_RSI;
  long in_RDI;
  bool bVar1;
  bool negative;
  Int128 result;
  Int128 local_30;
  long local_20;
  long local_18;
  Int128 local_10;
  
  local_20 = in_RSI;
  local_18 = in_RDI;
  Int128(&local_30);
  bVar1 = local_18 < 0;
  if (bVar1) {
    local_18 = -local_18;
  }
  if (local_20 < 0) {
    bVar1 = !bVar1;
    local_20 = -local_20;
  }
  DMul<unsigned_long,_unsigned_int>::mul
            (a,b,(unsigned_long *)result.high,(unsigned_long *)result.low);
  if (bVar1) {
    local_10 = operator-((Int128 *)0x149f18);
  }
  else {
    local_10.high = local_30.high;
    local_10.low = local_30.low;
  }
  return local_10;
}

Assistant:

btConvexHullInternal::Int128 btConvexHullInternal::Int128::mul(int64_t a, int64_t b)
{
	Int128 result;
	
#ifdef USE_X86_64_ASM
	__asm__ ("imulq %[b]"
					 : "=a" (result.low), "=d" (result.high)
					 : "0"(a), [b] "r"(b)
					 : "cc" );
	return result;
	
#else
	bool negative = a < 0;
	if (negative)
	{
		a = -a;
	}
	if (b < 0)
	{
		negative = !negative;
		b = -b;
	}
	DMul<uint64_t, uint32_t>::mul((uint64_t) a, (uint64_t) b, result.low, result.high);
	return negative ? -result : result;
#endif
}